

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

int av1_hash_is_vertical_perfect(YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  uint8_t uVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  uint8_t *puVar5;
  short *psVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  short *psVar12;
  ulong uVar13;
  
  iVar3 = (picture->field_4).field_0.y_stride;
  lVar9 = (long)iVar3;
  lVar4 = (long)(y_start * iVar3);
  puVar5 = (picture->field_5).buffers[0] + lVar4 + x_start;
  if ((picture->flags & 8) == 0) {
    uVar7 = 0;
    uVar8 = 0;
    if (0 < block_size) {
      uVar8 = (ulong)(uint)block_size;
    }
    puVar10 = (picture->field_5).buffers[0] + lVar4 + x_start + lVar9;
    for (; puVar11 = puVar10, uVar13 = (ulong)(uint)block_size, uVar7 != uVar8; uVar7 = uVar7 + 1) {
      while (uVar13 - 1 != 0) {
        uVar1 = *puVar11;
        puVar11 = puVar11 + lVar9;
        uVar13 = uVar13 - 1;
        if (uVar1 != puVar5[uVar7]) {
          return 0;
        }
      }
      puVar10 = puVar10 + 1;
    }
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    if (0 < block_size) {
      uVar8 = (ulong)(uint)block_size;
    }
    psVar6 = (short *)(lVar9 * 2 + (long)puVar5 * 2);
    for (; psVar12 = psVar6, uVar13 = (ulong)(uint)block_size, uVar7 != uVar8; uVar7 = uVar7 + 1) {
      while (uVar13 - 1 != 0) {
        sVar2 = *psVar12;
        psVar12 = psVar12 + lVar9;
        uVar13 = uVar13 - 1;
        if (sVar2 != *(short *)((long)puVar5 * 2 + uVar7 * 2)) {
          return 0;
        }
      }
      psVar6 = psVar6 + 1;
    }
  }
  return 1;
}

Assistant:

int av1_hash_is_vertical_perfect(const YV12_BUFFER_CONFIG *picture,
                                 int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j * stride + i] != p16[i]) {
          return 0;
        }
      }
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j * stride + i] != p[i]) {
          return 0;
        }
      }
    }
  }
  return 1;
}